

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O3

void __thiscall deqp::egl::TestThread::run(TestThread *this)

{
  bool bVar1;
  
  this->m_status = THREADSTATUS_RUNNING;
  bVar1 = MultiThreadedTest::execTest(this->m_test,this);
  if (bVar1) {
    this->m_status = THREADSTATUS_READY;
  }
  else {
    this->m_status = THREADSTATUS_ERROR;
  }
  return;
}

Assistant:

void TestThread::run (void)
{
	m_status = THREADSTATUS_RUNNING;

	try
	{
		if (m_test.execTest(*this))
			m_status = THREADSTATUS_READY;
		else
			m_status = THREADSTATUS_ERROR;
	}
	catch (const TestThread::TestStop&)
	{
		getLog() << ThreadLog::BeginMessage << "Thread stopped" << ThreadLog::EndMessage;
	}
	catch (const tcu::NotSupportedError& e)
	{
		getLog() << ThreadLog::BeginMessage << "Not supported: '" << e.what() << "'" << ThreadLog::EndMessage;
	}
	catch (const std::exception& e)
	{
		getLog() << ThreadLog::BeginMessage << "Got exception: '" << e.what() << "'" << ThreadLog::EndMessage;
	}
	catch (...)
	{
		getLog() << ThreadLog::BeginMessage << "Unknown exception" << ThreadLog::EndMessage;
	}
}